

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveconfig.cpp
# Opt level: O1

void __thiscall naiveconfig::print(naiveconfig *this)

{
  byte bVar1;
  in_addr __in;
  char *pcVar2;
  char local_a8 [8];
  char dest_ip [128];
  
  __in.s_addr = this->proxy_ipaddr;
  pcVar2 = inet_ntoa((in_addr)this->dest_ipaddr);
  strcpy(local_a8,pcVar2);
  if ((this->hostname)._M_string_length == 0) {
    bVar1 = this->protocol;
    pcVar2 = inet_ntoa(__in);
    printf("PROTOCOL:          %s\nnproxy_server_ip:  %s\nnproxy_port:       %d\ndest_ipaddr:       %s\ndest_port:         %d\n"
           ,protocol_name + bVar1,pcVar2,(ulong)this->proxy_port,local_a8,(ulong)this->dest_port);
  }
  else {
    bVar1 = this->protocol;
    pcVar2 = inet_ntoa(__in);
    printf("PROTOCOL:          %s\nnproxy_server_ip:  %s\nnproxy_port:       %d\nhostname:          %s\ndest_ipaddr:       %s\ndest_port:         %d\n"
           ,protocol_name + bVar1,pcVar2,(ulong)this->proxy_port,(this->hostname)._M_dataplus._M_p,
           local_a8,(uint)this->dest_port);
  }
  return;
}

Assistant:

void naiveconfig::print()
{
    struct in_addr nproxy_server;
    nproxy_server.s_addr = proxy_ipaddr;

    struct in_addr dest_server;
    dest_server.s_addr = dest_ipaddr;
    char dest_ip[128];
    strcpy(dest_ip, inet_ntoa(dest_server));

    if (hostname.length() == 0)
    {
        //注意，inet_ntoa是不可重入的。
        printf("PROTOCOL:          %s\n"
               "nproxy_server_ip:  %s\n"
               "nproxy_port:       %d\n"
               "dest_ipaddr:       %s\n"
               "dest_port:         %d\n",
               protocol_name[protocol],
               inet_ntoa(nproxy_server),
               proxy_port,
               dest_ip,
               dest_port);
    }
    else
    {
        //注意，inet_ntoa是不可重入的。
        printf("PROTOCOL:          %s\n"
               "nproxy_server_ip:  %s\n"
               "nproxy_port:       %d\n"
               "hostname:          %s\n"
               "dest_ipaddr:       %s\n"
               "dest_port:         %d\n",
               protocol_name[protocol],
               inet_ntoa(nproxy_server),
               proxy_port,
               hostname.c_str(),
               dest_ip,
               dest_port);
    }
}